

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_single_word_trailing_delim_Test<char8_t>::
WordSplitSVTest_single_word_trailing_delim_Test
          (WordSplitSVTest_single_word_trailing_delim_Test<char8_t> *this)

{
  WordSplitSVTest_single_word_trailing_delim_Test<char8_t> *this_local;
  
  WordSplitSVTest<char8_t>::WordSplitSVTest(&this->super_WordSplitSVTest<char8_t>);
  *(undefined ***)&this->super_WordSplitSVTest<char8_t> =
       &PTR__WordSplitSVTest_single_word_trailing_delim_Test_00823140;
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, single_word_trailing_delim) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}